

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_edge_swap
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node)

{
  int item;
  int iVar1;
  REF_INT last;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_DBL *pRVar5;
  int iVar6;
  uint uVar7;
  REF_INT RVar8;
  REF_STATUS RVar9;
  REF_INT RVar10;
  long lVar11;
  undefined8 uVar12;
  REF_INT *pRVar13;
  REF_NODE ref_node;
  REF_INT RVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  REF_CELL pRVar18;
  long lVar19;
  REF_BOOL all_local;
  REF_INT node2;
  REF_INT node3;
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  int local_7c;
  REF_INT local_78;
  REF_INT local_74;
  REF_CELL local_70;
  REF_INT local_68;
  REF_INT local_64;
  int local_60;
  int local_5c [4];
  int local_4c;
  long local_48;
  REF_NODE local_40;
  ulong local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  pRVar13 = ref_node->part;
  iVar6 = ref_node->ref_mpi->id;
  if (((iVar6 != pRVar13[node0]) || (iVar6 != pRVar13[node1])) || (iVar6 != pRVar13[node])) {
LAB_001af141:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
    return 0;
  }
  if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return 0;
  }
  if (-1 < node0) {
    pRVar18 = ref_grid->cell[8];
    pRVar2 = pRVar18->ref_adj;
    if ((node0 < pRVar2->nnode) && (lVar11 = (long)pRVar2->first[node0], lVar11 != -1)) {
      pRVar4 = pRVar2->item + lVar11;
      iVar6 = pRVar18->node_per;
      local_70 = pRVar18;
      local_48 = lVar11;
      local_40 = ref_node;
      while( true ) {
        if (0 < iVar6) {
          item = pRVar4->ref;
          uVar16 = 0;
          do {
            local_38 = uVar16;
            if (pRVar18->c2n[pRVar18->size_per * item + (int)uVar16] == node1) {
              uVar7 = ref_list_contains(ref_cavity->tet_list,item,local_5c + 3);
              if (uVar7 != 0) {
                pcVar17 = "have tet?";
                uVar12 = 0x522;
                goto LAB_001aefa4;
              }
              if (local_5c[3] != 0) {
                pcVar17 = "added tet twice?";
                uVar12 = 0x523;
                goto LAB_001af1d8;
              }
              uVar7 = ref_list_push(ref_cavity->tet_list,item);
              if (uVar7 != 0) {
                pcVar17 = "save tet";
                uVar12 = 0x524;
                goto LAB_001aefa4;
              }
              uVar7 = ref_cell_all_local(local_70,local_40,item,&local_7c);
              if (uVar7 != 0) {
                pcVar17 = "local cell";
                uVar12 = 0x525;
                goto LAB_001aefa4;
              }
              if (local_7c == 0) goto LAB_001af141;
              iVar6 = local_70->face_per;
              pRVar18 = local_70;
              if (0 < iVar6) {
                lVar11 = 0;
                lVar19 = 0;
                do {
                  pRVar13 = pRVar18->c2n;
                  iVar1 = pRVar18->size_per;
                  pRVar3 = pRVar18->f2n;
                  lVar15 = 0;
                  do {
                    local_5c[lVar15] =
                         pRVar13[(long)*(int *)((long)pRVar3 + lVar15 * 4 + lVar11) +
                                 (long)iVar1 * (long)item];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  if ((local_5c[1] != node0 && local_5c[0] != node0) && local_5c[2] != node0 ||
                      (local_5c[1] != node1 && local_5c[0] != node1) && local_5c[2] != node1) {
                    uVar7 = ref_cavity_insert_face(ref_cavity,local_5c);
                    if (uVar7 != 0) {
                      pcVar17 = "tet side";
                      uVar12 = 0x534;
                      goto LAB_001aefa4;
                    }
                    iVar6 = local_70->face_per;
                    pRVar18 = local_70;
                  }
                  lVar19 = lVar19 + 1;
                  lVar11 = lVar11 + 0x10;
                } while (lVar19 < iVar6);
              }
            }
            uVar7 = (int)local_38 + 1;
            uVar16 = (ulong)uVar7;
            iVar6 = pRVar18->node_per;
          } while ((int)uVar7 < iVar6);
        }
        pRVar4 = pRVar18->ref_adj->item;
        lVar11 = (long)pRVar4[(int)local_48].next;
        ref_node = local_40;
        if (lVar11 == -1) break;
        pRVar4 = pRVar4 + lVar11;
        local_48 = lVar11;
      }
    }
  }
  pRVar18 = ref_grid->cell[3];
  uVar7 = ref_cell_has_side(pRVar18,node0,node1,&local_4c);
  if (uVar7 == 0) {
    if (local_4c == 0) {
LAB_001af3fc:
      RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x562,"ref_cavity_form_edge_swap",1,"swap face manifold");
        pRVar5 = ref_node->real;
        lVar11 = (long)ref_cavity->node;
        printf(" %f %f %f\n",pRVar5[lVar11 * 0xf],pRVar5[lVar11 * 0xf + 1],pRVar5[lVar11 * 0xf + 2])
        ;
        return 1;
      }
      RVar9 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar9 == 0) {
        return 0;
      }
      pcVar17 = "swap seg manifold";
      uVar7 = 1;
      uVar12 = 0x563;
      uVar16 = 1;
      goto LAB_001aefa7;
    }
    uVar7 = ref_swap_node23(ref_grid,node0,node1,&local_78,&local_74);
    if (uVar7 == 0) {
      ref_cavity->surf_node = local_78;
      local_60 = -1;
      if (((node0 < 0) || (pRVar2 = pRVar18->ref_adj, pRVar2->nnode <= node0)) ||
         (lVar11 = (long)pRVar2->first[node0], lVar11 == -1)) {
        iVar6 = ref_cavity->tri_list->n;
        if (iVar6 == 2) {
LAB_001af16b:
          pcVar17 = "faceid not set";
          uVar12 = 0x54e;
LAB_001af1d8:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar12,"ref_cavity_form_edge_swap",pcVar17);
          return 1;
        }
LAB_001af2e7:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x54d,"ref_cavity_form_edge_swap","expect two tri",2,(long)iVar6);
        return 1;
      }
      pRVar4 = pRVar2->item + lVar11;
      RVar10 = pRVar18->node_per;
      RVar8 = -1;
      while( true ) {
        if (0 < RVar10) {
          last = pRVar4->ref;
          pRVar13 = pRVar18->c2n;
          RVar14 = pRVar18->size_per;
          lVar19 = 0;
          do {
            if (pRVar13[RVar14 * last + lVar19] == node1) {
              uVar7 = ref_list_push(ref_cavity->tri_list,last);
              if (uVar7 != 0) {
                pcVar17 = "save tri";
                uVar12 = 0x544;
                goto LAB_001aefa4;
              }
              uVar7 = ref_cell_all_local(pRVar18,ref_node,last,&local_7c);
              if (uVar7 != 0) {
                pcVar17 = "local cell";
                uVar12 = 0x546;
                goto LAB_001aefa4;
              }
              if (local_7c == 0) goto LAB_001af141;
              pRVar13 = pRVar18->c2n;
              RVar14 = pRVar18->size_per;
              RVar10 = pRVar18->node_per;
              RVar8 = pRVar13[RVar14 * last + RVar10];
            }
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 < RVar10);
        }
        pRVar4 = pRVar18->ref_adj->item;
        lVar11 = (long)pRVar4[(int)lVar11].next;
        if (lVar11 == -1) break;
        pRVar4 = pRVar4 + lVar11;
      }
      iVar6 = ref_cavity->tri_list->n;
      local_60 = RVar8;
      if (iVar6 != 2) goto LAB_001af2e7;
      if (RVar8 == -1) goto LAB_001af16b;
      local_64 = local_74;
      local_68 = node0;
      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_68);
      if (uVar7 == 0) {
        local_68 = local_74;
        local_64 = node1;
        uVar7 = ref_cavity_insert_seg(ref_cavity,&local_68);
        if (uVar7 == 0) {
          local_64 = local_78;
          local_68 = node1;
          uVar7 = ref_cavity_insert_seg(ref_cavity,&local_68);
          if (uVar7 == 0) {
            local_68 = local_78;
            local_64 = node0;
            uVar7 = ref_cavity_insert_seg(ref_cavity,&local_68);
            if (uVar7 == 0) goto LAB_001af3fc;
            pcVar17 = "tri side";
            uVar12 = 0x55a;
          }
          else {
            pcVar17 = "tri side";
            uVar12 = 0x557;
          }
        }
        else {
          pcVar17 = "tri side";
          uVar12 = 0x554;
        }
      }
      else {
        pcVar17 = "tri side";
        uVar12 = 0x551;
      }
    }
    else {
      pcVar17 = "nodes 2 and 3";
      uVar12 = 0x53e;
    }
  }
  else {
    pcVar17 = "triangle side";
    uVar12 = 0x53b;
  }
LAB_001aefa4:
  uVar16 = (ulong)uVar7;
LAB_001aefa7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar12,
         "ref_cavity_form_edge_swap",uVar16,pcVar17);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_swap(REF_CAVITY ref_cavity,
                                             REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT node2, node3, face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");

  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3),
        "nodes 2 and 3");

    ref_cavity_surf_node(ref_cavity) = node2;

    seg_nodes[2] = REF_EMPTY;
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    REIS(2, ref_list_n(ref_cavity_tri_list(ref_cavity)), "expect two tri");
    RUS(REF_EMPTY, seg_nodes[2], "faceid not set");
    seg_nodes[0] = node0;
    seg_nodes[1] = node3;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node3;
    seg_nodes[1] = node1;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node1;
    seg_nodes[1] = node2;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node2;
    seg_nodes[1] = node0;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "swap face manifold", {
    printf(" %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "swap seg manifold");

  return REF_SUCCESS;
}